

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_write_chunk_reverse(p_ply ply,void *anybuffer,size_t size)

{
  int iVar1;
  size_t in_RDX;
  void *in_RSI;
  p_ply in_RDI;
  int ret;
  
  ply_reverse(in_RSI,in_RDX);
  iVar1 = ply_write_chunk(in_RDI,in_RSI,in_RDX);
  ply_reverse(in_RSI,in_RDX);
  return iVar1;
}

Assistant:

static int ply_write_chunk_reverse(p_ply ply, void *anybuffer, size_t size) {
    int ret = 0;
    ply_reverse(anybuffer, size);
    ret = ply_write_chunk(ply, anybuffer, size);
    ply_reverse(anybuffer, size);
    return ret;
}